

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O0

iterator * __thiscall
gmlc::containers::StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end
          (StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_> *this)

{
  long in_RSI;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> *in_RDI;
  Endpoint **ptr;
  Endpoint **ptr_1;
  Endpoint **local_38;
  Endpoint **local_18;
  Endpoint **local_10 [2];
  
  if (*(int *)(in_RSI + 0x18) == 0x20) {
    if (*(long *)(in_RSI + 8) == 0) {
      local_38 = &end::emptyValue;
    }
    else {
      local_38 = (Endpoint **)(*(long *)(in_RSI + 8) + (long)(*(int *)(in_RSI + 0x14) + 1) * 8);
    }
    local_10[0] = local_38;
    BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**>::BlockIterator(in_RDI,local_10,0);
  }
  else {
    local_18 = (Endpoint **)(*(long *)(in_RSI + 8) + (long)*(int *)(in_RSI + 0x14) * 8);
    BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**>::BlockIterator
              (in_RDI,&local_18,*(int *)(in_RSI + 0x18));
  }
  return in_RDI;
}

Assistant:

iterator end()
        {
            static X* emptyValue{nullptr};
            if (bsize == blockSize) {
                X** ptr = (dataptr != nullptr) ? &(dataptr[dataSlotIndex + 1]) :
                                                 &emptyValue;
                return {ptr, 0};
            }
            X** ptr = &(dataptr[dataSlotIndex]);
            return {ptr, bsize};
        }